

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall
cs::instance_type::parse_define_structured_binding
          (instance_type *this,iterator it,bool constant,bool link)

{
  token_base **pptVar1;
  iterator __args;
  iterator it_local;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  tree_node *local_28;
  iterator local_20;
  
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  it_local = it;
  local_48._M_unused._M_object = operator_new(0x18);
  *(_Any_data **)local_48._M_unused._0_8_ = &local_48;
  *(instance_type **)((long)local_48._M_unused._0_8_ + 8) = this;
  *(bool *)((long)local_48._M_unused._0_8_ + 0x10) = constant;
  *(bool *)((long)local_48._M_unused._0_8_ + 0x11) = link;
  local_48._8_8_ = local_68._8_8_;
  local_68._M_unused._M_object = (_func_int **)0x0;
  local_68._8_8_ = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_38 = std::
             _Function_handler<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/instance.cpp:293:13)>
             ::_M_manager;
  pcStack_30 = std::
               _Function_handler<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/instance/instance.cpp:293:13)>
               ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  if (constant) {
    local_20 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar1 = tree_type<cs::token_base_*>::iterator::data(&local_20);
    local_68._M_unused._M_object = (*pptVar1)[1]._vptr_token_base;
    if ((_func_int **)local_68._M_unused._0_8_ != (_func_int **)0x0) {
      *(_func_int **)((long)local_68._M_unused._0_8_ + 8) =
           *(_func_int **)((long)local_68._M_unused._0_8_ + 8) + 1;
    }
  }
  else {
    local_28 = (tree_node *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    runtime_type::parse_expr((runtime_type *)&local_68,(iterator *)this,SUB81(&local_28,0));
  }
  __args = tree_type<cs::token_base_*>::iterator::left(&it_local);
  std::function<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&)>::operator()
            ((function<void_(cs::tree_type<cs::token_base_*>::iterator,_const_cs_impl::any_&)> *)
             &local_48,__args,(any *)&local_68);
  cs_impl::any::recycle((any *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

void
	instance_type::parse_define_structured_binding(tree_type<token_base *>::iterator it, bool constant, bool link)
	{
		std::function<void(tree_type<token_base *>::iterator, const var &)> process;
		process = [&process, this, constant, link](tree_type<token_base *>::iterator it, const var &val) {
			auto &pl = static_cast<token_parallel *>(it.data())->get_parallel();
			if (val.type() != typeid(array))
				throw runtime_error("Only support structured binding with array while variable definition.");
			auto &arr = val.const_val<array>();
			if (pl.size() != arr.size())
				throw runtime_error("Unmatched structured binding while variable definition.");
			for (std::size_t i = 0; i < pl.size(); ++i) {
				if (pl[i].root().data()->get_type() == token_types::parallel)
					process(pl[i].root(), arr[i]);
				else
					storage.add_var_no_return(static_cast<token_id *>(pl[i].root().data())->get_id(),
					                          constant || link ? arr[i] : copy(arr[i]), constant);
			}
		};
		const var &val = constant ? static_cast<token_value *>(it.right().data())->get_value() : parse_expr(it.right());
		process(it.left(), val);
	}